

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.c
# Opt level: O3

void asm_append_u32(MCodeChunk *chunk,uint32_t arg)

{
  asm_append_u8(chunk,(uint8_t)arg);
  asm_append_u8(chunk,(uint8_t)(arg >> 8));
  asm_append_u8(chunk,(uint8_t)(arg >> 0x10));
  asm_append_u8(chunk,(uint8_t)(arg >> 0x18));
  return;
}

Assistant:

void asm_append_u32(MCodeChunk *chunk, uint32_t arg) {
#if ARCH_ENDIAN == ENDIAN_LITTLE
	asm_append_u8(chunk, (uint8_t) arg);
	asm_append_u8(chunk, (uint8_t) (arg >> 8));
	asm_append_u8(chunk, (uint8_t) (arg >> 16));
	asm_append_u8(chunk, (uint8_t) (arg >> 24));
#else
	asm_append_u8(chunk, (uint8_t) (arg >> 24));
	asm_append_u8(chunk, (uint8_t) (arg >> 16));
	asm_append_u8(chunk, (uint8_t) (arg >> 8));
	asm_append_u8(chunk, (uint8_t) arg);
#endif
}